

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::addCanonIterPropertyStarts
          (Normalizer2Impl *this,USetAdder *sa,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int start;
  uint32_t value;
  uint32_t local_34;
  
  UVar1 = ensureCanonIterData(this,errorCode);
  if (UVar1 != '\0') {
    start = 0;
    iVar2 = ucptrie_getRange_63(this->fCanonIterData->trie,0,UCPMAP_RANGE_NORMAL,0,
                                segmentStarterMapper,(void *)0x0,&local_34);
    while (-1 < iVar2) {
      (*(code *)sa->add)(sa->set,start);
      start = iVar2 + 1;
      iVar2 = ucptrie_getRange_63(this->fCanonIterData->trie,start,UCPMAP_RANGE_NORMAL,0,
                                  segmentStarterMapper,(void *)0x0,&local_34);
    }
  }
  return;
}

Assistant:

void
Normalizer2Impl::addCanonIterPropertyStarts(const USetAdder *sa, UErrorCode &errorCode) const {
    // Add the start code point of each same-value range of the canonical iterator data trie.
    if (!ensureCanonIterData(errorCode)) { return; }
    // Currently only used for the SEGMENT_STARTER property.
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(fCanonIterData->trie, start, UCPMAP_RANGE_NORMAL, 0,
                                   segmentStarterMapper, nullptr, &value)) >= 0) {
        sa->add(sa->set, start);
        start = end + 1;
    }
}